

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stbfile * stb_openf(FILE *f)

{
  stbfile *__dest;
  stbfile *z;
  stbfile m;
  FILE *f_local;
  
  m.field_12 = (anon_union_8_2_1b07d41e_for_stbfile_12)f;
  memcpy(&z,&PTR_stb__fgetbyte_0025ac20,0x68);
  __dest = (stbfile *)malloc(0x68);
  if (__dest != (stbfile *)0x0) {
    memcpy(__dest,&z,0x68);
    __dest->f = (FILE *)m.field_12;
  }
  return __dest;
}

Assistant:

stbfile *stb_openf(FILE *f)
{
   stbfile m = { stb__fgetbyte, stb__fgetdata,
                 stb__fputbyte, stb__fputdata,
                 stb__fsize, stb__ftell, stb__fbackpatch, stb__fclose,
                 0,0,0, };
   stbfile *z = (stbfile *) malloc(sizeof(*z));
   if (z) {
      *z = m;
      z->f = f;
   }
   return z;
}